

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::BlendView(DBaseStatusBar *this,float *blend)

{
  AActor *pAVar1;
  player_t *ppVar2;
  player_t **pppVar3;
  
  V_AddBlend((float)BaseBlendR / 255.0,(float)BaseBlendG / 255.0,(float)BaseBlendB / 255.0,
             BaseBlendA * underwater_fade_scalar.Value,blend);
  pppVar3 = &this->CPlayer;
  V_AddPlayerBlend(this->CPlayer,blend,1.0,0xe4);
  ppVar2 = this->CPlayer;
  if (screen->Accel2D == false) {
    pAVar1 = (ppVar2->camera).field_0.p;
    if (pAVar1 == (AActor *)0x0) goto LAB_004d09bf;
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (ppVar2->camera).field_0.p = (AActor *)0x0;
      goto LAB_004d09bf;
    }
    if (ConsoleState != c_up || menuactive != MENU_Off) goto LAB_004d09bf;
    ppVar2 = *pppVar3;
  }
  pAVar1 = (ppVar2->camera).field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (pAVar1->player != (player_t *)0x0) {
        pppVar3 = &pAVar1->player;
      }
    }
    else {
      (ppVar2->camera).field_0.p = (AActor *)0x0;
    }
  }
  ppVar2 = *pppVar3;
  V_AddBlend(ppVar2->BlendR,ppVar2->BlendG,ppVar2->BlendB,ppVar2->BlendA,blend);
LAB_004d09bf:
  V_SetBlend((int)(*blend * 255.0),(int)(blend[1] * 255.0),(int)(blend[2] * 255.0),
             (int)(blend[3] * 256.0));
  return;
}

Assistant:

void DBaseStatusBar::BlendView (float blend[4])
{
	// [Nash] Allow user to set blend intensity
	float cnt = (BaseBlendA * underwater_fade_scalar);

	V_AddBlend (BaseBlendR / 255.f, BaseBlendG / 255.f, BaseBlendB / 255.f, cnt, blend);
	V_AddPlayerBlend(CPlayer, blend, 1.0f, 228);

	if (screen->Accel2D || (CPlayer->camera != NULL && menuactive == MENU_Off && ConsoleState == c_up))
	{
		player_t *player = (CPlayer->camera != NULL && CPlayer->camera->player != NULL) ? CPlayer->camera->player : CPlayer;
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	V_SetBlend ((int)(blend[0] * 255.0f), (int)(blend[1] * 255.0f),
				(int)(blend[2] * 255.0f), (int)(blend[3] * 256.0f));
}